

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void libcellml::fixComponentUnits(ModelPtr *model,ComponentPtr *component)

{
  ulong uVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string *name;
  element_type *this;
  element_type *this_00;
  size_t sVar6;
  ComponentEntity local_a8;
  ulong local_98;
  size_t c;
  string local_80;
  UnitsPtr units;
  undefined1 local_40 [16];
  VariablePtr variable;
  size_t v;
  ComponentPtr *component_local;
  ModelPtr *model_local;
  
  variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var2._M_pi = variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Component::variableCount(peVar4);
    if (p_Var5 <= _Var2._M_pi) break;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    Component::variable((Component *)&stack0xffffffffffffffd0,(size_t)peVar4);
    std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )&stack0xffffffffffffffd0);
    Variable::units((Variable *)local_40);
    bVar3 = std::operator!=((shared_ptr<libcellml::Units> *)local_40,(nullptr_t)0x0);
    std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_40);
    if (bVar3) {
      name = (string *)
             std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)model);
      std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&stack0xffffffffffffffd0);
      Variable::units((Variable *)&c);
      this = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&c);
      NamedEntity::name_abi_cxx11_(&local_80,&this->super_NamedEntity);
      Model::units((Model *)&stack0xffffffffffffffa0,name);
      std::__cxx11::string::~string((string *)&local_80);
      std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)&c);
      bVar3 = std::operator!=((shared_ptr<libcellml::Units> *)&stack0xffffffffffffffa0,
                              (nullptr_t)0x0);
      if (bVar3) {
        this_00 = std::
                  __shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&stack0xffffffffffffffd0);
        Variable::setUnits(this_00,(UnitsPtr *)&stack0xffffffffffffffa0);
      }
      std::shared_ptr<libcellml::Units>::~shared_ptr
                ((shared_ptr<libcellml::Units> *)&stack0xffffffffffffffa0);
    }
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)&stack0xffffffffffffffd0);
    variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         ((long)&(variable.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  local_98 = 0;
  while( true ) {
    uVar1 = local_98;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    sVar6 = ComponentEntity::componentCount(&peVar4->super_ComponentEntity);
    if (sVar6 <= uVar1) break;
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)component);
    ComponentEntity::component(&local_a8,(size_t)peVar4);
    fixComponentUnits(model,(ComponentPtr *)&local_a8);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_a8);
    local_98 = local_98 + 1;
  }
  return;
}

Assistant:

void fixComponentUnits(const ModelPtr &model, const ComponentPtr &component)
{
    for (size_t v = 0; v < component->variableCount(); ++v) {
        auto variable = component->variable(v);
        if (variable->units() != nullptr) {
            // Find the units in the model and switch out.
            auto units = model->units(variable->units()->name());
            if (units != nullptr) {
                variable->setUnits(units);
            }
        }
    }
    for (size_t c = 0; c < component->componentCount(); ++c) {
        fixComponentUnits(model, component->component(c));
    }
}